

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::EnsureAuxStatementData(FunctionBody *this)

{
  Recycler *alloc;
  AuxStatementData *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->m_sourceInfo).m_auxStatementData.ptr != (AuxStatementData *)0x0) {
    return;
  }
  local_40 = (undefined1  [8])&AuxStatementData::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1f38;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_40);
  this_00 = (AuxStatementData *)new<Memory::Recycler>(0x10,alloc,0x37a1d4);
  AuxStatementData::AuxStatementData(this_00);
  Memory::WriteBarrierPtr<Js::FunctionBody::AuxStatementData>::WriteBarrierSet
            (&(this->m_sourceInfo).m_auxStatementData,this_00);
  return;
}

Assistant:

void FunctionBody::EnsureAuxStatementData()
    {
        if (m_sourceInfo.m_auxStatementData == nullptr)
        {
            Recycler* recycler = m_scriptContext->GetRecycler();

            // Note: allocating must be consistent with clean up in CleanupToReparse.
            m_sourceInfo.m_auxStatementData = RecyclerNew(recycler, AuxStatementData);
        }
    }